

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O0

int run_test_getaddrinfo_basic_sync(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_getaddrinfo_t req;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar2,&eval_a,0,name,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getaddrinfo.c"
            ,0xad,
            "uv_getaddrinfo(uv_default_loop(), &req, ((void*)0), name, ((void*)0), ((void*)0))","=="
            ,"0",(long)iVar1,"==",0);
    abort();
  }
  uv_freeaddrinfo(req.service);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getaddrinfo.c"
            ,0xb0,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(getaddrinfo_basic_sync) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  uv_getaddrinfo_t req;

  ASSERT_OK(uv_getaddrinfo(uv_default_loop(),
                           &req,
                           NULL,
                           name,
                           NULL,
                           NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}